

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.cpp
# Opt level: O2

QDataStream * operator<<(QDataStream *s,QSize *sz)

{
  qint32 i;
  QDataStream *pQVar1;
  
  i = (sz->wd).m_i;
  if (s->ver == 1) {
    pQVar1 = QDataStream::operator<<(s,(qint16)i);
    QDataStream::operator<<(pQVar1,(qint16)(sz->ht).m_i);
  }
  else {
    pQVar1 = QDataStream::operator<<(s,i);
    QDataStream::operator<<(pQVar1,(sz->ht).m_i);
  }
  return s;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QSize &sz)
{
    if (s.version() == 1)
        s << (qint16)sz.width() << (qint16)sz.height();
    else
        s << (qint32)sz.width() << (qint32)sz.height();
    return s;
}